

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void LLGrammatical(vector<quadraple,_std::allocator<quadraple>_> *token)

{
  undefined1 local_168 [8];
  LLGrammaticalAnalyzer analyzer;
  vector<quadraple,_std::allocator<quadraple>_> *token_local;
  
  analyzer.TABLE._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)token;
  LLGrammaticalAnalyzer::LLGrammaticalAnalyzer((LLGrammaticalAnalyzer *)local_168);
  LLGrammaticalAnalyzer::CalcFIRST((LLGrammaticalAnalyzer *)local_168);
  LLGrammaticalAnalyzer::PrintFIRST((LLGrammaticalAnalyzer *)local_168);
  LLGrammaticalAnalyzer::CalcFOLLOW((LLGrammaticalAnalyzer *)local_168);
  LLGrammaticalAnalyzer::PrintFOLLOW((LLGrammaticalAnalyzer *)local_168);
  LLGrammaticalAnalyzer::CreateTABLE((LLGrammaticalAnalyzer *)local_168);
  LLGrammaticalAnalyzer::AnalyzeToken
            ((LLGrammaticalAnalyzer *)local_168,
             (vector<quadraple,_std::allocator<quadraple>_> *)
             analyzer.TABLE._M_t._M_impl.super__Rb_tree_header._M_node_count);
  LLGrammaticalAnalyzer::~LLGrammaticalAnalyzer((LLGrammaticalAnalyzer *)local_168);
  return;
}

Assistant:

void LLGrammatical(vector <quadraple> &token){
    LLGrammaticalAnalyzer analyzer;
    //analyzer.PrintProductionRules();
    analyzer.CalcFIRST();
    analyzer.PrintFIRST();
    analyzer.CalcFOLLOW();
    analyzer.PrintFOLLOW();
    analyzer.CreateTABLE();
    analyzer.AnalyzeToken(token);
}